

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

CURLcode tool2curlparts(CURL *curl,tool_mime *m,curl_mime *mime)

{
  curl_mime *pcVar1;
  CURLcode CVar2;
  CURLcode CVar3;
  long lVar4;
  char *pcVar5;
  curl_mime *submime;
  curl_mime *local_38;
  
  local_38 = (curl_mime *)0x0;
  if (m == (tool_mime *)0x0) {
    CVar2 = CURLE_OK;
  }
  else {
    CVar2 = tool2curlparts(curl,m->prev,mime);
    lVar4 = 0;
    if ((CVar2 == CURLE_OK) && (lVar4 = curl_mime_addpart(mime), CVar2 = CURLE_OK, lVar4 == 0)) {
      CVar2 = CURLE_OUT_OF_MEMORY;
    }
    if (CVar2 == CURLE_OK) {
      pcVar5 = m->filename;
      CVar2 = CURLE_OK;
      switch(m->kind) {
      case TOOLMIME_PARTS:
        CVar2 = tool2curlmime(curl,m,&local_38);
        pcVar1 = local_38;
        if ((CVar2 == CURLE_OK) &&
           (CVar3 = curl_mime_subparts(lVar4,local_38), CVar2 = CURLE_OK, CVar3 != CURLE_OK)) {
          curl_mime_free(pcVar1);
          CVar2 = CVar3;
        }
        break;
      case TOOLMIME_DATA:
        CVar2 = curl_mime_data(lVar4,m->data,0xffffffffffffffff);
        break;
      case TOOLMIME_FILE:
      case TOOLMIME_FILEDATA:
        CVar2 = curl_mime_filedata(lVar4,m->data);
        if ((CVar2 == CURLE_OK) &&
           (CVar2 = CURLE_OK, pcVar5 == (char *)0x0 && m->kind == TOOLMIME_FILEDATA)) {
          pcVar5 = (char *)0x0;
          CVar2 = curl_mime_filename(lVar4,0);
        }
        break;
      case TOOLMIME_STDIN:
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "-";
        }
      case TOOLMIME_STDINDATA:
        CVar2 = curl_mime_data_cb(lVar4,m->size,tool_mime_stdin_read,tool_mime_stdin_seek,0,m);
      }
    }
    else {
      pcVar5 = (char *)0x0;
    }
    if (pcVar5 != (char *)0x0 && CVar2 == CURLE_OK) {
      CVar2 = curl_mime_filename(lVar4,pcVar5);
    }
    if (CVar2 == CURLE_OK) {
      CVar2 = curl_mime_type(lVar4,m->type);
    }
    if (CVar2 == CURLE_OK) {
      CVar2 = curl_mime_headers(lVar4,m->headers,0);
    }
    if (CVar2 == CURLE_OK) {
      CVar2 = curl_mime_encoder(lVar4,m->encoder);
    }
    if (CVar2 == CURLE_OK) {
      CVar2 = curl_mime_name(lVar4,m->name);
      return CVar2;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode tool2curlparts(CURL *curl, tool_mime *m, curl_mime *mime)
{
  CURLcode ret = CURLE_OK;
  curl_mimepart *part = NULL;
  curl_mime *submime = NULL;
  const char *filename = NULL;

  if(m) {
    ret = tool2curlparts(curl, m->prev, mime);
    if(!ret) {
      part = curl_mime_addpart(mime);
      if(!part)
        ret = CURLE_OUT_OF_MEMORY;
    }
    if(!ret) {
      filename = m->filename;
      switch(m->kind) {
      case TOOLMIME_PARTS:
        ret = tool2curlmime(curl, m, &submime);
        if(!ret) {
          ret = curl_mime_subparts(part, submime);
          if(ret)
            curl_mime_free(submime);
        }
        break;

      case TOOLMIME_DATA:
#ifdef CURL_DOES_CONVERSIONS
        /* Our data is always textual: convert it to ASCII. */
        {
          size_t size = strlen(m->data);
          char *cp = malloc(size + 1);

          if(!cp)
            ret = CURLE_OUT_OF_MEMORY;
          else {
            memcpy(cp, m->data, size + 1);
            ret = convert_to_network(cp, size);
            if(!ret)
              ret = curl_mime_data(part, cp, CURL_ZERO_TERMINATED);
            free(cp);
          }
        }
#else
        ret = curl_mime_data(part, m->data, CURL_ZERO_TERMINATED);
#endif
        break;

      case TOOLMIME_FILE:
      case TOOLMIME_FILEDATA:
        ret = curl_mime_filedata(part, m->data);
        if(!ret && m->kind == TOOLMIME_FILEDATA && !filename)
          ret = curl_mime_filename(part, NULL);
        break;

      case TOOLMIME_STDIN:
        if(!filename)
          filename = "-";
        /* FALLTHROUGH */
      case TOOLMIME_STDINDATA:
        ret = curl_mime_data_cb(part, m->size,
                                (curl_read_callback) tool_mime_stdin_read,
                                (curl_seek_callback) tool_mime_stdin_seek,
                                NULL, m);
        break;

      default:
        /* Other cases not possible in this context. */
        break;
      }
    }
    if(!ret && filename)
      ret = curl_mime_filename(part, filename);
    if(!ret)
      ret = curl_mime_type(part, m->type);
    if(!ret)
      ret = curl_mime_headers(part, m->headers, 0);
    if(!ret)
      ret = curl_mime_encoder(part, m->encoder);
    if(!ret)
      ret = curl_mime_name(part, m->name);
  }
  return ret;
}